

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O2

void __thiscall
booster::aio::stream_socket::async_write(stream_socket *this,const_buffer *buffer,io_handler *h)

{
  const_buffer *__return_storage_ptr__;
  stream_socket *this_00;
  bool bVar1;
  error_category *peVar2;
  size_t sVar3;
  writer_all *this_01;
  size_t sVar4;
  io_service *piVar5;
  atomic_counter *this_02;
  intrusive_ptr<booster::aio::(anonymous_namespace)::writer_all> local_70;
  callback<void_(const_std::error_code_&)> local_68;
  pointer r;
  error_code e_1;
  error_code e;
  
  bVar1 = basic_io_device::dont_block((basic_io_device *)this,h);
  if (!bVar1) {
    return;
  }
  e._M_value = 0;
  peVar2 = (error_category *)std::_V2::system_category();
  e._M_cat = peVar2;
  sVar3 = write_some(this,buffer,&e);
  if (e._M_value == 0) {
    sVar4 = buffer_impl<const_char_*>::bytes_count(&buffer->super_buffer_impl<const_char_*>);
    if (sVar3 == sVar4) goto LAB_001795a5;
  }
  else {
    bVar1 = basic_io_device::would_block(&e);
    if (!bVar1) {
LAB_001795a5:
      piVar5 = basic_io_device::get_io_service((basic_io_device *)this);
      io_service::post(piVar5,h,&e,sVar3);
      return;
    }
  }
  this_01 = (writer_all *)operator_new(0x58);
  callable<void_(const_std::error_code_&)>::callable
            ((callable<void_(const_std::error_code_&)> *)this_01);
  (this_01->super_callable<void_(const_std::error_code_&)>).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__writer_all_001d91a0;
  __return_storage_ptr__ = &this_01->buf;
  details::advance<booster::aio::const_buffer>(__return_storage_ptr__,buffer,sVar3);
  this_01->count = sVar3;
  this_01->self = this;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::intrusive_ptr
            (&(this_01->h).call_ptr,&h->call_ptr);
  this_02 = &(this_01->super_callable<void_(const_std::error_code_&)>).super_refcounted.refs_;
  r.p_ = this_01;
  atomic_counter::inc(this_02);
  e_1._M_value = 0;
  e_1._M_cat = peVar2;
  sVar3 = write_some(this_01->self,__return_storage_ptr__,&e_1);
  this_01->count = this_01->count + sVar3;
  operator+=(__return_storage_ptr__,sVar3);
  if (((__return_storage_ptr__->super_buffer_impl<const_char_*>).size_ == 0) ||
     ((e_1._M_value != 0 && (bVar1 = basic_io_device::would_block(&e_1), !bVar1)))) {
    piVar5 = basic_io_device::get_io_service((basic_io_device *)this_01->self);
    io_service::post(piVar5,&this_01->h,&e_1,this_01->count);
  }
  else {
    this_00 = this_01->self;
    local_70.p_ = this_01;
    atomic_counter::inc(this_02);
    callback<void_(const_std::error_code_&)>::
    callback<booster::aio::(anonymous_namespace)::writer_all>(&local_68,&local_70);
    basic_io_device::on_writeable((basic_io_device *)this_00,&local_68);
    intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              (&local_68.call_ptr);
    intrusive_ptr<booster::aio::(anonymous_namespace)::writer_all>::~intrusive_ptr(&local_70);
  }
  intrusive_ptr<booster::aio::(anonymous_namespace)::writer_all>::~intrusive_ptr(&r);
  return;
}

Assistant:

void stream_socket::async_write(const_buffer const &buffer,io_handler const &h)
{
	if(!dont_block(h))
		return;

	#ifdef BOOSTER_AIO_FORCE_POLL
	writer_all::pointer r(new writer_all(this,buffer,0,h));
	r->run();
	#else
	system::error_code e;
	size_t n = write_some(buffer,e);
	if((!e && n!=buffer.bytes_count()) || (e && would_block(e))) {
		writer_all::pointer r(new writer_all(this,buffer,n,h));
		r->run();
	}
	else {
		get_io_service().post(h,e,n);
	}
	#endif




}